

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O0

TextureBindInfo * __thiscall
Diligent::ShaderVariableManagerGL::
GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>
          (ShaderVariableManagerGL *this,Uint32 ResIndex)

{
  OffsetType OVar1;
  Uint32 UVar2;
  Char *Message;
  OffsetType Offset;
  Uint32 local_3c;
  undefined1 local_38 [8];
  string msg;
  Uint32 ResIndex_local;
  ShaderVariableManagerGL *this_local;
  
  msg.field_2._12_4_ = ResIndex;
  UVar2 = GetNumResources<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this);
  if (UVar2 <= ResIndex) {
    local_3c = GetNumResources<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this);
    FormatString<char[17],unsigned_int,char[30],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Resource index (",
               (char (*) [17])((long)&msg.field_2 + 0xc),(uint *)") exceeds max allowed value (",
               (char (*) [30])&local_3c,(uint *)0xf65f2d,(char (*) [2])local_38);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetConstResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0xdd);
    std::__cxx11::string::~string((string *)local_38);
  }
  OVar1 = GetResourceOffset<Diligent::ShaderVariableManagerGL::TextureBindInfo>(this);
  return (TextureBindInfo *)
         ((long)(this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                m_pVariables + (ulong)(uint)msg.field_2._12_4_ * 0x18 + (long)(int)(uint)OVar1);
}

Assistant:

const ResourceType& GetConstResource(Uint32 ResIndex) const
    {
        VERIFY(ResIndex < GetNumResources<ResourceType>(), "Resource index (", ResIndex, ") exceeds max allowed value (", GetNumResources<ResourceType>(), ")");
        auto Offset = GetResourceOffset<ResourceType>();
        return reinterpret_cast<const ResourceType*>(reinterpret_cast<const Uint8*>(m_pVariables) + Offset)[ResIndex];
    }